

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O1

string * license::test::sign_data(string *__return_storage_ptr__,string *data,string *test_name)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  ostream *poVar4;
  shared_count *local_550;
  ulong local_548;
  shared_count sStack_540;
  undefined4 **local_538;
  int retCode;
  path outputFile;
  string output_file_s;
  path licenses_base;
  undefined4 local_4bc;
  path lcc_exe;
  undefined4 *local_498;
  int *local_490;
  undefined1 local_488;
  undefined8 local_480;
  shared_count sStack_478;
  ifstream ifs;
  ulong local_468;
  undefined1 *local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_458;
  undefined8 auStack_388 [36];
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  stringstream ss;
  undefined7 uStack_1d7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1c8 [7];
  ios_base local_158 [264];
  undefined **local_50;
  undefined1 local_48;
  undefined1 *local_40;
  char *local_38;
  
  lcc_exe.m_pathname._M_dataplus._M_p = (pointer)&lcc_exe.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&lcc_exe,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O1/extern/license-generator/src/license_generator/lccgen"
             ,"");
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x3f);
  boost::filesystem::detail::status((detail *)&ifs,&lcc_exe,(error_code *)0x0);
  ss = (stringstream)(_ifs == 2);
  aaStack_1c8[0]._M_allocated_capacity = 0;
  _ifs = &PTR__lazy_ostream_00542dd8;
  local_460 = boost::unit_test::lazy_ostream::inst;
  pbStack_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x42053e;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_210 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&aaStack_1c8[0]._M_allocated_capacity);
  licenses_base.m_pathname._M_dataplus._M_p = (pointer)&licenses_base.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&licenses_base,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O1/Testing/Temporary/DEFAULT/licenses"
             ,"");
  boost::filesystem::detail::status((detail *)&ifs,&licenses_base,(error_code *)0x0);
  if (_ifs < 2) {
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_220 = "";
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x42);
    uVar3 = boost::filesystem::detail::create_directories(&licenses_base,(error_code *)0x0);
    local_550 = (shared_count *)CONCAT71(local_550._1_7_,uVar3);
    local_548 = 0;
    sStack_540.pi_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   "test folders created ",&licenses_base.m_pathname);
    _ifs = &PTR__lazy_ostream_00542e18;
    local_460 = boost::unit_test::lazy_ostream::inst;
    local_248 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_240 = "";
    pbStack_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss;
    boost::test_tools::tt_detail::report_assertion(&local_550,&ifs,&local_248,0x42,2,1,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ss != aaStack_1c8) {
      operator_delete(_ss);
    }
    boost::detail::shared_count::~shared_count(&sStack_540);
  }
  local_468 = local_468 & 0xffffffffffffff00;
  _ifs = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&ifs,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O1/Testing/Temporary"
             ,"");
  pcVar1 = (test_name->_M_dataplus)._M_p;
  local_550 = &sStack_540;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_550,pcVar1,pcVar1 + test_name->_M_string_length);
  std::__cxx11::string::append((char *)&local_550);
  _ss = (pointer)aaStack_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ss,local_550,(long)&local_550->pi_ + local_548);
  boost::filesystem::path::operator/=((path *)&ifs,(path *)&ss);
  outputFile.m_pathname._M_dataplus._M_p = (pointer)&outputFile.m_pathname.field_2;
  if (_ifs == &local_460) {
    outputFile.m_pathname.field_2._8_8_ = pbStack_458;
  }
  else {
    outputFile.m_pathname._M_dataplus._M_p = (pointer)_ifs;
  }
  outputFile.m_pathname.field_2._M_allocated_capacity = (size_type)local_460;
  outputFile.m_pathname._M_string_length = local_468;
  local_460 = (undefined1 *)((ulong)local_460 & 0xffffffffffffff00);
  _ifs = &local_460;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != aaStack_1c8) {
    operator_delete(_ss);
  }
  if (local_550 != &sStack_540) {
    operator_delete(local_550);
  }
  if (_ifs != &local_460) {
    operator_delete(_ifs);
  }
  output_file_s._M_dataplus._M_p = (pointer)&output_file_s.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&output_file_s,outputFile.m_pathname._M_dataplus._M_p,
             outputFile.m_pathname._M_dataplus._M_p + outputFile.m_pathname._M_string_length);
  remove(output_file_s._M_dataplus._M_p);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aaStack_1c8[0]._M_local_buf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O1/extern/license-generator/src/license_generator/lccgen"
             ,0x97);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aaStack_1c8[0]._M_local_buf," test sign",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aaStack_1c8[0]._M_local_buf," --primary-key ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aaStack_1c8[0]._M_local_buf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/projects/DEFAULT/private_key.rsa"
             ,0x79);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aaStack_1c8[0]._M_local_buf," -d ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aaStack_1c8[0]._M_local_buf,(data->_M_dataplus)._M_p,data->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aaStack_1c8[0]._M_local_buf," -o ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aaStack_1c8[0]._M_local_buf,output_file_s._M_dataplus._M_p,
             output_file_s._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)std::cout,"executing :",0xb);
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)std::cout,(char *)_ifs,0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (_ifs != &local_460) {
    operator_delete(_ifs);
  }
  std::__cxx11::stringbuf::str();
  retCode = system((char *)_ifs);
  if (_ifs != &local_460) {
    operator_delete(_ifs);
  }
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x51);
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_00542e58;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_490 = &retCode;
  local_488 = retCode == 0;
  local_498 = &local_4bc;
  local_4bc = 0;
  local_480 = 0;
  sStack_478.pi_ = (sp_counted_base *)0x0;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_1e0 = "";
  pbStack_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_490;
  _ifs = &PTR__lazy_ostream_00542e98;
  local_460 = boost::unit_test::lazy_ostream::inst;
  local_538 = &local_498;
  local_548 = local_548 & 0xffffffffffffff00;
  local_550 = (shared_count *)&PTR__lazy_ostream_00542e98;
  sStack_540.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_478);
  boost::filesystem::detail::status((detail *)&ifs,&outputFile,(error_code *)0x0);
  if (1 < _ifs) {
    std::ifstream::ifstream(&ifs,output_file_s._M_dataplus._M_p,_S_in);
    uVar2 = *(undefined8 *)((long)auStack_388 + (long)_ifs[-3]);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,uVar2,0xffffffff,0,0xffffffff);
    std::ifstream::~ifstream(&ifs);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output_file_s._M_dataplus._M_p != &output_file_s.field_2) {
      operator_delete(output_file_s._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputFile.m_pathname._M_dataplus._M_p != &outputFile.m_pathname.field_2) {
      operator_delete(outputFile.m_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)licenses_base.m_pathname._M_dataplus._M_p != &licenses_base.m_pathname.field_2) {
      operator_delete(licenses_base.m_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lcc_exe.m_pathname._M_dataplus._M_p != &lcc_exe.m_pathname.field_2) {
      operator_delete(lcc_exe.m_pathname._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("fs::exists(outputFile)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
                ,0x52,"string license::test::sign_data(const string &, const string &)");
}

Assistant:

string sign_data(const string& data, const string& test_name) {
	fs::path lcc_exe(LCC_EXE);
	BOOST_REQUIRE_MESSAGE(fs::is_regular_file(lcc_exe), "License generator not found: " LCC_EXE);
	fs::path licenses_base(LCC_LICENSES_BASE);
	if (!fs::exists(licenses_base)) {
		BOOST_REQUIRE_MESSAGE(fs::create_directories(licenses_base), "test folders created " + licenses_base.string());
	}

	const fs::path outputFile(fs::path(PROJECT_TEST_TEMP_DIR) / (test_name + ".tmp"));
	const string output_file_s = outputFile.string();
	remove(output_file_s.c_str());

	stringstream ss;
	ss << LCC_EXE << " test sign";
	ss << " --" PARAM_PRIMARY_KEY " " << LCC_PROJECT_PRIVATE_KEY;
	ss << " -d " << data;
	ss << " -o " << output_file_s;

	cout << "executing :" << ss.str() << endl;
	const int retCode = std::system(ss.str().c_str());
	BOOST_CHECK_EQUAL(retCode, 0);
	BOOST_ASSERT(fs::exists(outputFile));
	std::ifstream ifs(output_file_s.c_str());
	std::string content((std::istreambuf_iterator<char>(ifs)), (std::istreambuf_iterator<char>()));
	return content;
}